

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

int fs_makedir_recursive(char *path)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  char buffer [2048];
  undefined8 uStack_840;
  char local_838 [2047];
  undefined1 local_39;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_840 = (code *)0x1d232c;
  strncpy(local_838,path,0x7ff);
  local_39 = 0;
  uStack_840 = (code *)0x1d233c;
  sVar3 = strlen(local_838);
  if (1 < (int)(uint)sVar3) {
    uVar4 = 1;
    do {
      cVar1 = local_838[uVar4];
      if ((cVar1 == '/') || ((cVar1 == '\\' && (local_838[uVar4 - 1] != ':')))) {
        local_838[uVar4] = '\0';
        uStack_840 = (code *)0x1d2379;
        iVar2 = fs_makedir(local_838);
        if (iVar2 < 0) {
          iVar2 = -1;
          goto LAB_001d2391;
        }
        local_838[uVar4] = cVar1;
      }
      uVar4 = uVar4 + 1;
    } while (((uint)sVar3 & 0x7fffffff) != uVar4);
  }
  uStack_840 = (code *)0x1d2391;
  iVar2 = fs_makedir(path);
LAB_001d2391:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar2;
  }
  uStack_840 = fs_chdir;
  __stack_chk_fail();
}

Assistant:

int fs_makedir_recursive(const char *path)
{
	char buffer[2048];
	int len;
	int i;
	str_copy(buffer, path, sizeof(buffer));
	len = str_length(buffer);
	// ignore a leading slash
	for(i = 1; i < len; i++)
	{
		char b = buffer[i];
		if(b == '/' || (b == '\\' && buffer[i-1] != ':'))
		{
			buffer[i] = 0;
			if(fs_makedir(buffer) < 0)
			{
				return -1;
			}
			buffer[i] = b;

		}
	}
	return fs_makedir(path);
}